

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_30(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  shared_ptr<LNode> else_branch;
  shared_ptr<LNode> stmt1;
  shared_ptr<LNode> then_branch;
  shared_ptr<LNode> condition;
  undefined1 local_dc [44];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  LNodeIEStmt local_a8;
  __shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<LNode> stmt0;
  shared_ptr<LNodeData<LNodeIEStmt>_> r;
  
  get_node((LParser *)&condition,in_ESI);
  get_node((LParser *)&stmt0,in_ESI);
  get_node((LParser *)&then_branch,in_ESI);
  get_node((LParser *)&stmt1,in_ESI);
  get_node((LParser *)&else_branch,in_ESI);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,(__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&then_branch);
  std::static_pointer_cast<LNodeData<LNodeChildren>,LNode>(&local_a8.condition);
  std::vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>::push_back
            ((vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_> *)
             (local_a8.condition.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1),
             (value_type *)&stmt0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.condition.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,&else_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::static_pointer_cast<LNodeData<LNodeChildren>,LNode>(&local_a8.condition);
  std::vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>::push_back
            ((vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_> *)
             (local_a8.condition.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1),
             &stmt1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.condition.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  local_dc._0_4_ = 0x30;
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_dc + 0x24),
             &condition.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_dc + 0x14),
             &then_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_dc + 4),
             &else_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  LNodeIEStmt::LNodeIEStmt
            (&local_a8,(shared_ptr<LNode> *)(local_dc + 0x24),(shared_ptr<LNode> *)(local_dc + 0x14)
             ,(shared_ptr<LNode> *)(local_dc + 4));
  std::make_shared<LNodeData<LNodeIEStmt>,LNodeType,LNodeIEStmt>
            ((LNodeType *)&r,(LNodeIEStmt *)local_dc);
  LNodeIEStmt::~LNodeIEStmt(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_dc + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_dc + 0x1c));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  _Var1 = r.super___shared_ptr<LNodeData<LNodeIEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  r.super___shared_ptr<LNodeData<LNodeIEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (LLexer *)r.super___shared_ptr<LNodeData<LNodeIEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  r.super___shared_ptr<LNodeData<LNodeIEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<LNodeData<LNodeIEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&else_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stmt1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&then_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stmt0.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&condition.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_30() {
    // IEStmt : IF Expr Brs THEN Brs NIEStmt NIEStmts ELSE Brs Stmt Stmts END Brs
    auto condition = this->get_node(12);
    auto stmt0 = this->get_node(8);
    auto then_branch = this->get_node(7);
    auto stmt1 = this->get_node(4);
    auto else_branch = this->get_node(3);
    lnode_get<LNodeChildren>(then_branch)->value.push_front(stmt0);
    lnode_get<LNodeChildren>(else_branch)->value.push_front(stmt1);
    auto r = std::make_shared<LNodeData<LNodeIEStmt>>(
            LNodeType::IEStmt,
            LNodeIEStmt(condition, then_branch, else_branch)
    );
    return r;
}